

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

int flatbuffers::Vector<keyfield::sample::Bar_const*,unsigned_int>::
    KeyCompare<flatbuffers::Array<float,(unsigned_short)3>*>(void *ap,void *bp)

{
  float fVar1;
  float fVar2;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    fVar1 = *(float *)((long)bp + lVar3 * 4);
    fVar2 = *(float *)(*ap + lVar3 * 4);
    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) break;
    lVar3 = lVar3 + 1;
    if (lVar3 == 3) {
      return 0;
    }
  }
  return (uint)(fVar1 < fVar2) - (uint)(fVar2 < fVar1);
}

Assistant:

static int KeyCompare(const void *ap, const void *bp) {
    const K *key = reinterpret_cast<const K *>(ap);
    const uint8_t *data = reinterpret_cast<const uint8_t *>(bp);
    auto table = IndirectHelper<T>::Read(data, 0);

    // std::bsearch compares with the operands transposed, so we negate the
    // result here.
    return -table->KeyCompareWithValue(*key);
  }